

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O3

void __thiscall SAT::checkConflict(SAT *this)

{
  char cVar1;
  uint uVar2;
  Clause *pCVar3;
  ulong uVar4;
  lbool lVar5;
  char cVar6;
  ulong uVar7;
  
  pCVar3 = this->confl;
  uVar4 = (ulong)*(uint *)pCVar3;
  if (0xff < *(uint *)pCVar3) {
    uVar7 = 0;
    lVar5.value = ::l_False.value;
    do {
      uVar2 = pCVar3->data[uVar7].x;
      cVar1 = (this->assigns).data[(uint)((int)uVar2 >> 1)];
      cVar6 = -cVar1;
      if ((uVar2 & 1) == 0) {
        cVar6 = cVar1;
      }
      if (cVar6 != lVar5.value) {
        printf("Analyze: %dth lit is not false\n",uVar7 & 0xffffffff);
        pCVar3 = this->confl;
        uVar4 = (ulong)*(uint *)pCVar3;
        lVar5 = ::l_False;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar4 >> 8);
  }
  return;
}

Assistant:

void SAT::checkConflict() const {
	assert(confl != nullptr);
	for (unsigned int i = 0; i < confl->size(); i++) {
		if (value((*confl)[i]) != l_False) {
			printf("Analyze: %dth lit is not false\n", i);
		}
		assert(value((*confl)[i]) == l_False);
	}

	/*
		printf("Clause %d\n", learnts.size());
		printf("Conflict clause: ");
		printClause(*confl);
	*/
}